

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

bool SeenLocal(CService *addr)

{
  long lVar1;
  bool bVar2;
  pointer ppVar3;
  char *in_RDI;
  long in_FS_OFFSET;
  iterator it;
  UniqueLock<GlobalMutex> criticalblock21;
  key_type *in_stack_ffffffffffffff98;
  map<CNetAddr,_LocalServiceInfo,_std::less<CNetAddr>,_std::allocator<std::pair<const_CNetAddr,_LocalServiceInfo>_>_>
  *in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  undefined4 in_stack_ffffffffffffffb8;
  undefined1 fTry;
  int in_stack_ffffffffffffffbc;
  char *in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  byte bVar4;
  UniqueLock<GlobalMutex> *in_stack_ffffffffffffffd8;
  
  fTry = (undefined1)((uint)in_stack_ffffffffffffffb8 >> 0x18);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<GlobalMutex>((GlobalMutex *)in_stack_ffffffffffffff98);
  UniqueLock<GlobalMutex>::UniqueLock
            (in_stack_ffffffffffffffd8,
             (GlobalMutex *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),in_RDI,
             in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,(bool)fTry);
  std::
  map<CNetAddr,_LocalServiceInfo,_std::less<CNetAddr>,_std::allocator<std::pair<const_CNetAddr,_LocalServiceInfo>_>_>
  ::find(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::
  map<CNetAddr,_LocalServiceInfo,_std::less<CNetAddr>,_std::allocator<std::pair<const_CNetAddr,_LocalServiceInfo>_>_>
  ::end(in_stack_ffffffffffffffa0);
  bVar2 = std::operator==((_Self *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),
                          (_Self *)in_stack_ffffffffffffffa0);
  if (!bVar2) {
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_CNetAddr,_LocalServiceInfo>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_CNetAddr,_LocalServiceInfo>_> *)
                        in_stack_ffffffffffffff98);
    (ppVar3->second).nScore = (ppVar3->second).nScore + 1;
  }
  bVar4 = !bVar2;
  UniqueLock<GlobalMutex>::~UniqueLock((UniqueLock<GlobalMutex> *)in_stack_ffffffffffffff98);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (bool)(bVar4 & 1);
}

Assistant:

bool SeenLocal(const CService& addr)
{
    LOCK(g_maplocalhost_mutex);
    const auto it = mapLocalHost.find(addr);
    if (it == mapLocalHost.end()) return false;
    ++it->second.nScore;
    return true;
}